

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arena.h
# Opt level: O3

OneHotLayerParams *
google::protobuf::Arena::CreateMessageInternal<CoreML::Specification::OneHotLayerParams>
          (Arena *arena)

{
  OneHotLayerParams *this;
  
  if (arena == (Arena *)0x0) {
    this = (OneHotLayerParams *)operator_new(0x30);
    CoreML::Specification::OneHotLayerParams::OneHotLayerParams(this,(Arena *)0x0,false);
  }
  else {
    this = (OneHotLayerParams *)
           AllocateAlignedWithHook
                     (arena,0x30,(type_info *)&CoreML::Specification::OneHotLayerParams::typeinfo);
    CoreML::Specification::OneHotLayerParams::OneHotLayerParams(this,arena,false);
  }
  return this;
}

Assistant:

PROTOBUF_NDEBUG_INLINE static T* CreateMessageInternal(Arena* arena) {
    static_assert(
        InternalHelper<T>::is_arena_constructable::value,
        "CreateMessage can only construct types that are ArenaConstructable");
    if (arena == NULL) {
      // Generated arena constructor T(Arena*) is protected. Call via
      // InternalHelper.
      return InternalHelper<T>::New();
    } else {
      return arena->DoCreateMessage<T>();
    }
  }